

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less_equal *comp)

{
  char cVar1;
  char cVar2;
  xpath_memory_block *na;
  bool bVar3;
  double dVar4;
  double dVar5;
  xpath_allocator_capture cr;
  xpath_node_set_raw rs;
  xpath_allocator_capture cri;
  xpath_node_set_raw ls;
  xpath_allocator_capture crii;
  xpath_allocator_capture local_f0;
  xpath_allocator *local_d0;
  xpath_memory_block *local_c8;
  xpath_memory_block *pxStack_c0;
  xpath_node *local_b8;
  xpath_allocator_capture local_b0;
  xpath_node_set_raw local_90;
  xpath_node *local_70;
  xpath_allocator_capture local_68;
  xpath_string local_48;
  
  cVar1 = lhs->_rettype;
  cVar2 = rhs->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      local_f0._target = stack->result;
      local_f0._state._root = (local_f0._target)->_root;
      local_f0._state._root_size = (local_f0._target)->_root_size;
      local_f0._state._error = (local_f0._target)->_error;
      eval_node_set(&local_90,lhs,c,stack,nodeset_eval_all);
      eval_node_set((xpath_node_set_raw *)&local_d0,rhs,c,stack,nodeset_eval_all);
      while (bVar3 = local_90._begin != local_90._end, bVar3) {
        local_b0._target = stack->result;
        local_b0._state._error = (local_b0._target)->_error;
        local_b0._state._root = (local_b0._target)->_root;
        local_b0._state._root_size = (local_b0._target)->_root_size;
        local_70 = local_90._begin;
        string_value((xpath_string *)&local_68,local_90._begin,local_b0._target);
        dVar4 = convert_string_to_number((char_t *)local_68._target);
        na = local_c8;
        while (na != pxStack_c0) {
          local_68._target = stack->result;
          local_68._state._error = (local_68._target)->_error;
          local_68._state._root = (local_68._target)->_root;
          local_68._state._root_size = (local_68._target)->_root_size;
          string_value(&local_48,(xpath_node *)na,local_68._target);
          dVar5 = convert_string_to_number(local_48._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_68);
          na = (xpath_memory_block *)&na->field_2;
          if (dVar4 <= dVar5) {
            xpath_allocator_capture::~xpath_allocator_capture(&local_b0);
            goto LAB_001123c8;
          }
        }
        xpath_allocator_capture::~xpath_allocator_capture(&local_b0);
        local_90._begin = local_70 + 1;
      }
    }
    else if (cVar1 == '\x01' || cVar2 != '\x01') {
      if ((cVar1 != '\x01') || (cVar2 == '\x01')) {
        __assert_fail("false && \"Wrong types\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x25d5,
                      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less_equal]"
                     );
      }
      local_f0._target = stack->result;
      local_f0._state._root = (local_f0._target)->_root;
      local_f0._state._root_size = (local_f0._target)->_root_size;
      local_f0._state._error = (local_f0._target)->_error;
      eval_node_set(&local_90,lhs,c,stack,nodeset_eval_all);
      dVar4 = eval_number(rhs,c,stack);
      do {
        bVar3 = local_90._begin != local_90._end;
        if (local_90._begin == local_90._end) break;
        local_d0 = stack->result;
        local_b8 = (xpath_node *)local_d0->_error;
        local_c8 = local_d0->_root;
        pxStack_c0 = (xpath_memory_block *)local_d0->_root_size;
        string_value((xpath_string *)&local_b0,local_90._begin,local_d0);
        dVar5 = convert_string_to_number((char_t *)local_b0._target);
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_d0);
        local_90._begin = local_90._begin + 1;
      } while (dVar4 < dVar5);
    }
    else {
      local_f0._target = stack->result;
      local_f0._state._root = (local_f0._target)->_root;
      local_f0._state._root_size = (local_f0._target)->_root_size;
      local_f0._state._error = (local_f0._target)->_error;
      dVar4 = eval_number(lhs,c,stack);
      eval_node_set(&local_90,rhs,c,stack,nodeset_eval_all);
      do {
        bVar3 = local_90._begin != local_90._end;
        if (local_90._begin == local_90._end) break;
        local_d0 = stack->result;
        local_b8 = (xpath_node *)local_d0->_error;
        local_c8 = local_d0->_root;
        pxStack_c0 = (xpath_memory_block *)local_d0->_root_size;
        string_value((xpath_string *)&local_b0,local_90._begin,local_d0);
        dVar5 = convert_string_to_number((char_t *)local_b0._target);
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_d0);
        local_90._begin = local_90._begin + 1;
      } while (dVar5 < dVar4);
    }
LAB_001123c8:
    xpath_allocator_capture::~xpath_allocator_capture(&local_f0);
  }
  else {
    dVar4 = eval_number(lhs,c,stack);
    dVar5 = eval_number(rhs,c,stack);
    bVar3 = dVar4 <= dVar5;
  }
  return bVar3;
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(false && "Wrong types"); // unreachable
				return false;
			}
		}